

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::draw
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,_texture_size *texture_size)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1a00))(0,0,texture_size->m_size);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glViewport() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x1ca);
  (**(code **)(lVar3 + 0x188))(0x4100);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glClear() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x1ce);
  (**(code **)(lVar3 + 0x538))(0,0,texture_size->m_n_cubemaps * 6);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x1d1);
  return;
}

Assistant:

void TextureCubeMapArrayColorDepthAttachmentsTest::draw(const _texture_size& texture_size)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up the viewport */
	gl.viewport(0, /* x */
				0, /* y */
				texture_size.m_size, texture_size.m_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	/* Clear color & depth buffers */
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

	gl.drawArrays(GL_POINTS, 0 /* first */, texture_size.m_n_cubemaps * 6 /* layer-faces per cube-map */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "drawArrays");
}